

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::LoadArchive
          (DearchiverBase *this,IDataBlob *pArchiveData,Uint32 ContentVersion,bool MakeCopy)

{
  undefined *puVar1;
  bool bVar2;
  IDataBlob *pIVar3;
  pointer pDVar4;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *this_00;
  pointer ppVar5;
  reference this_01;
  pointer pDVar6;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  this_02;
  ResourceData *this_03;
  pointer pvVar7;
  undefined8 uVar8;
  char (*in_R8) [33];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>,_bool>
  pVar9;
  bool local_1a9;
  undefined1 local_150 [8];
  string _msg;
  undefined1 local_120 [7];
  bool IsDuplicate;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  local_108;
  const_iterator it_other;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *OtherArchiveResources;
  NamedResourceKey local_e8;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
  local_d0;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>,_bool>
  it_inserted;
  char *pcStack_b8;
  bool MakeNameCopy;
  char *ResName;
  reference pvStack_a8;
  ResourceType ResType;
  value_type *it;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range1_1;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *ArchiveResources;
  size_t ArchiveIdx;
  CreateInfo local_60;
  unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
  local_50;
  unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
  pObjArchive;
  ArchiveData *Archive;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
  *__range1;
  bool MakeCopy_local;
  Uint32 ContentVersion_local;
  IDataBlob *pArchiveData_local;
  DearchiverBase *this_local;
  
  if (pArchiveData == (IDataBlob *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    __end1 = std::
             vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
             ::begin(&this->m_Archives);
    Archive = (ArchiveData *)
              std::
              vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
              ::end(&this->m_Archives);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
                                       *)&Archive), bVar2) {
      pObjArchive._M_t.
      super___uniq_ptr_impl<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::DeviceObjectArchive_*,_std::default_delete<Diligent::DeviceObjectArchive>_>
      .super__Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false>._M_head_impl =
           (__uniq_ptr_data<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
             ::operator*(&__end1);
      pDVar6 = std::
               unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
               ::operator->((unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                             *)pObjArchive._M_t.
                               super___uniq_ptr_impl<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Diligent::DeviceObjectArchive_*,_std::default_delete<Diligent::DeviceObjectArchive>_>
                               .super__Head_base<0UL,_Diligent::DeviceObjectArchive_*,_false>.
                               _M_head_impl);
      pIVar3 = DeviceObjectArchive::GetData(pDVar6);
      if (pIVar3 == pArchiveData) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<Diligent::DearchiverBase::ArchiveData_*,_std::vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>_>
      ::operator++(&__end1);
    }
    std::make_unique<Diligent::DeviceObjectArchive>();
    pDVar4 = std::
             unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
             ::operator->(&local_50);
    local_60.pData = pArchiveData;
    local_60.ContentVersion = ContentVersion;
    local_60.MakeCopy = MakeCopy;
    bVar2 = DeviceObjectArchive::Deserialize(pDVar4,&local_60);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      ArchiveResources =
           (unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
            *)std::
              vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
              ::size(&this->m_Archives);
      pDVar4 = std::
               unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>
               ::operator->(&local_50);
      this_00 = DeviceObjectArchive::GetNamedResources(pDVar4);
      __end1_1 = std::
                 unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                 ::begin(this_00);
      it = (value_type *)
           std::
           unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
           ::end(this_00);
      while (bVar2 = std::__detail::operator!=
                               (&__end1_1.
                                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                ,(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                  *)&it), bVar2) {
        pvStack_a8 = std::__detail::
                     _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                     ::operator*(&__end1_1);
        ResName._4_4_ = DeviceObjectArchive::NamedResourceKey::GetType(&pvStack_a8->first);
        pcStack_b8 = DeviceObjectArchive::NamedResourceKey::GetName(&pvStack_a8->first);
        it_inserted._15_1_ = 1;
        DeviceObjectArchive::NamedResourceKey::NamedResourceKey
                  (&local_e8,ResName._4_4_,pcStack_b8,true);
        pVar9 = std::
                unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>>
                ::emplace<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long_const&>
                          ((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,unsigned_long,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,unsigned_long>>>
                            *)&this->m_ResNameToArchiveIdx,&local_e8,
                           (unsigned_long *)&ArchiveResources);
        local_d0._M_cur =
             (__node_type *)
             pVar9.first.
             super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
             ._M_cur;
        it_inserted.first.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
        ._M_cur._0_1_ = pVar9.second;
        DeviceObjectArchive::NamedResourceKey::~NamedResourceKey(&local_e8);
        if (((byte)it_inserted.first.
                   super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false>
                   ._M_cur & 1) == 0) {
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_unsigned_long>,_false,_false>
                                 *)&local_d0);
          this_01 = std::
                    vector<Diligent::DearchiverBase::ArchiveData,_std::allocator<Diligent::DearchiverBase::ArchiveData>_>
                    ::operator[](&this->m_Archives,ppVar5->second);
          pDVar6 = std::
                   unique_ptr<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                   ::operator->(&this_01->pObjArchive);
          this_02._M_cur = (__node_type *)DeviceObjectArchive::GetNamedResources(pDVar6);
          it_other.
          super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                     )(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                       )this_02._M_cur;
          DeviceObjectArchive::NamedResourceKey::NamedResourceKey
                    ((NamedResourceKey *)local_120,ResName._4_4_,pcStack_b8,false);
          local_108._M_cur =
               (__node_type *)
               std::
               unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
               ::find((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                       *)this_02._M_cur,(NamedResourceKey *)local_120);
          DeviceObjectArchive::NamedResourceKey::~NamedResourceKey((NamedResourceKey *)local_120);
          _msg.field_2._8_8_ =
               std::
               unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
               ::end((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                      *)it_other.
                        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                        ._M_cur);
          bVar2 = std::__detail::operator!=
                            (&local_108,
                             (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              *)((long)&_msg.field_2 + 8));
          local_1a9 = false;
          if (bVar2) {
            this_03 = &pvStack_a8->second;
            pvVar7 = std::__detail::
                     _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                     ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                                   *)&local_108);
            local_1a9 = DeviceObjectArchive::ResourceData::operator==(this_03,&pvVar7->second);
          }
          if (local_1a9 == false) {
            FormatString<char[21],char_const*,char[33]>
                      ((string *)local_150,(Diligent *)"Resource with name \'",
                       (char (*) [21])&stack0xffffffffffffff48,
                       (char **)"\' already exists in the archive.",in_R8);
            puVar1 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar8 = std::__cxx11::string::c_str();
              in_R8 = (char (*) [33])0x0;
              (*(code *)puVar1)(2,uVar8,0);
            }
            std::__cxx11::string::~string((string *)local_150);
          }
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
        ::operator++(&__end1_1);
      }
      std::
      vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
      ::
      emplace_back<std::unique_ptr<Diligent::DeviceObjectArchive,std::default_delete<Diligent::DeviceObjectArchive>>>
                ((vector<Diligent::DearchiverBase::ArchiveData,std::allocator<Diligent::DearchiverBase::ArchiveData>>
                  *)&this->m_Archives,&local_50);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    ArchiveIdx._4_4_ = 1;
    std::
    unique_ptr<Diligent::DeviceObjectArchive,_std::default_delete<Diligent::DeviceObjectArchive>_>::
    ~unique_ptr(&local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool DearchiverBase::LoadArchive(const IDataBlob* pArchiveData, Uint32 ContentVersion, bool MakeCopy)
{
    if (pArchiveData == nullptr)
        return false;

    for (const ArchiveData& Archive : m_Archives)
    {
        if (Archive.pObjArchive->GetData() == pArchiveData)
        {
            // The archive is already loaded
            return true;
        }
    }

    std::unique_ptr<DeviceObjectArchive> pObjArchive = std::make_unique<DeviceObjectArchive>();
    if (!pObjArchive->Deserialize(DeviceObjectArchive::CreateInfo{pArchiveData, ContentVersion, MakeCopy}))
        return false;

    const size_t ArchiveIdx = m_Archives.size();

    const auto& ArchiveResources = pObjArchive->GetNamedResources();
    for (const auto& it : ArchiveResources)
    {
        const ResourceType ResType      = it.first.GetType();
        const char*        ResName      = it.first.GetName();
        constexpr bool     MakeNameCopy = true;

        const auto it_inserted = m_ResNameToArchiveIdx.emplace(NamedResourceKey{ResType, ResName, MakeNameCopy}, ArchiveIdx);
        if (!it_inserted.second)
        {
            const auto& OtherArchiveResources = m_Archives[it_inserted.first->second].pObjArchive->GetNamedResources();
            const auto  it_other              = OtherArchiveResources.find(NamedResourceKey{ResType, ResName});

            const bool IsDuplicate =
                (it_other != OtherArchiveResources.end()) &&
                (it.second == it_other->second);
            if (!IsDuplicate)
            {
                LOG_ERROR_MESSAGE("Resource with name '", ResName, "' already exists in the archive.");
            }
        }
    }

    m_Archives.emplace_back(std::move(pObjArchive));

    return true;
}